

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_deserialize_set_element
          (t_php_generator *this,ostream *out,t_set *tset,string *prefix)

{
  t_type *type;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string elem;
  t_field felem;
  allocator local_159;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  t_field local_d8;
  
  std::__cxx11::string::string((string *)&local_f8,"elem",(allocator *)&local_d8);
  t_generator::tmp(&local_158,(t_generator *)this,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  type = tset->elem_type_;
  std::__cxx11::string::string((string *)&local_118,(string *)&local_158);
  t_field::t_field(&local_d8,type,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"$");
  poVar2 = std::operator<<(poVar2,(string *)&local_158);
  poVar2 = std::operator<<(poVar2," = null;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_138,"",&local_159);
  generate_deserialize_field(this,out,&local_d8,&local_138,false);
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = php_is_scalar(this,tset->elem_type_);
  if (bVar1) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"$");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,"[$");
    poVar2 = std::operator<<(poVar2,(string *)&local_158);
    pcVar3 = "] = true;";
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"$");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,"[] = $");
    poVar2 = std::operator<<(poVar2,(string *)&local_158);
    pcVar3 = ";";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_field::~t_field(&local_d8);
  std::__cxx11::string::~string((string *)&local_158);
  return;
}

Assistant:

void t_php_generator::generate_deserialize_set_element(ostream& out, t_set* tset, string prefix) {
  string elem = tmp("elem");
  t_field felem(tset->get_elem_type(), elem);

  indent(out) << "$" << elem << " = null;" << endl;

  generate_deserialize_field(out, &felem);

  t_type* elem_type = tset->get_elem_type();
  if(php_is_scalar(elem_type)) {
    indent(out) << "$" << prefix << "[$" << elem << "] = true;" << endl;
  } else {
    indent(out) << "$" << prefix << "[] = $" << elem << ";" << endl;
  }
}